

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::ClientContext::FetchResultInternal
          (ClientContext *this,ClientContextLock *lock,PendingQueryResult *pending)

{
  ClientContextLock *this_00;
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *in_RAX;
  pointer pAVar5;
  type pPVar6;
  type pQVar7;
  long in_RCX;
  pointer *__ptr_1;
  pointer *__ptr;
  element_type *local_38;
  
  this_00 = lock + 0x4d;
  local_38 = in_RAX;
  pAVar5 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
           ::operator->((unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
                         *)this_00);
  unique_ptr<duckdb::Executor,_std::default_delete<duckdb::Executor>,_true>::operator*
            (&pAVar5->executor);
  pAVar5 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
           ::operator->((unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
                         *)this_00);
  pPVar6 = shared_ptr<duckdb::PreparedStatementData,_true>::operator*(&pAVar5->prepared);
  bVar1 = *(byte *)(in_RCX + 0x160);
  bVar2 = (pPVar6->properties).allow_stream_result;
  (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  Executor::GetResult((Executor *)&stack0xffffffffffffffc8);
  peVar4 = local_38;
  local_38 = (ClientContext *)0x0;
  peVar3 = (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  if (peVar3 != (element_type *)0x0) {
    (**(code **)(*(long *)&(peVar3->super_enable_shared_from_this<duckdb::ClientContext>).
                           __weak_this_ + 8))();
  }
  if (local_38 != (ClientContext *)0x0) {
    (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)&(((local_38->super_enable_shared_from_this<duckdb::ClientContext>).
                        __weak_this_.internal.
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_ + 8))->
              _M_pi)();
  }
  if ((bVar1 & bVar2) == 0) {
    CleanupInternal((ClientContext *)lock,(ClientContextLock *)pending,
                    (BaseQueryResult *)
                    (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                    internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,false);
  }
  else {
    pAVar5 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
             ::operator->((unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
                           *)this_00);
    pQVar7 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
             operator*((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                        *)this);
    pAVar5->open_result = &pQVar7->super_BaseQueryResult;
  }
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult> ClientContext::FetchResultInternal(ClientContextLock &lock, PendingQueryResult &pending) {
	D_ASSERT(active_query);
	D_ASSERT(active_query->IsOpenResult(pending));
	D_ASSERT(active_query->prepared);
	auto &executor = GetExecutor();
	auto &prepared = *active_query->prepared;
	bool create_stream_result = prepared.properties.allow_stream_result && pending.allow_stream_result;
	unique_ptr<QueryResult> result;
	D_ASSERT(executor.HasResultCollector());
	// we have a result collector - fetch the result directly from the result collector
	result = executor.GetResult();
	if (!create_stream_result) {
		CleanupInternal(lock, result.get(), false);
	} else {
		active_query->SetOpenResult(*result);
	}
	return result;
}